

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O1

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string *virtual_file,string *disk_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t __n;
  short *psVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ZeroCopyInputStream *pZVar9;
  int *piVar10;
  char *pcVar11;
  char *pcVar12;
  pointer old_prefix;
  string *psVar13;
  bool bVar14;
  string temp_disk_file;
  ZeroCopyInputStream *local_b8;
  string local_b0;
  DiskSourceTree *local_90;
  string *local_88;
  string *local_80;
  pointer local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_70.field_2;
  pcVar2 = (virtual_file->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + virtual_file->_M_string_length);
  CanonicalizePath(&local_b0,&local_70);
  __n = virtual_file->_M_string_length;
  if ((__n == local_b0._M_string_length) &&
     ((__n == 0 ||
      (iVar7 = bcmp((virtual_file->_M_dataplus)._M_p,local_b0._M_dataplus._M_p,__n), iVar7 == 0))))
  {
    local_80 = disk_file;
    iVar7 = std::__cxx11::string::compare((char *)virtual_file);
    bVar14 = true;
    if (iVar7 != 0) {
      psVar3 = (short *)(virtual_file->_M_dataplus)._M_p;
      uVar4 = virtual_file->_M_string_length;
      if ((long)uVar4 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (uVar4,"string length exceeds max size");
      }
      if ((uVar4 < 3) || ((char)psVar3[1] != '/' || *psVar3 != 0x2e2e)) {
        pcVar2 = (virtual_file->_M_dataplus)._M_p;
        uVar4 = virtual_file->_M_string_length;
        if ((long)uVar4 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (uVar4,"string length exceeds max size");
        }
        if ((uVar4 < 3) || (pcVar2[uVar4 - 1] != '.' || *(short *)(pcVar2 + (uVar4 - 3)) != 0x2e2f))
        {
          lVar8 = std::__cxx11::string::find((char *)virtual_file,0x43e172,0);
          bVar14 = lVar8 != -1;
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (!bVar14) {
      old_prefix = (this->mappings_).
                   super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_78 = (this->mappings_).
                 super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      bVar14 = old_prefix == local_78;
      local_90 = this;
      if (!bVar14) {
        local_88 = (string *)&this->last_error_message_;
        do {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          bVar6 = ApplyMapping(virtual_file,&old_prefix->virtual_path,&old_prefix->disk_path,
                               &local_b0);
          bVar5 = true;
          if (bVar6) {
            pZVar9 = OpenDiskFile(local_90,&local_b0);
            if (pZVar9 == (ZeroCopyInputStream *)0x0) {
              piVar10 = __errno_location();
              if (*piVar10 == 0xd) {
                std::operator+(&local_50,"Read access is denied for file: ",&local_b0);
                std::__cxx11::string::operator=(local_88,(string *)&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                bVar5 = false;
                local_b8 = (ZeroCopyInputStream *)0x0;
              }
            }
            else {
              if (local_80 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)local_80);
              }
              bVar5 = false;
              local_b8 = pZVar9;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if (!bVar5) break;
          old_prefix = old_prefix + 1;
          bVar14 = old_prefix == local_78;
        } while (!bVar14);
      }
      if (!bVar14) {
        return local_b8;
      }
      pcVar12 = (char *)(local_90->last_error_message_)._M_string_length;
      psVar13 = &local_90->last_error_message_;
      pcVar11 = "File not found.";
      goto LAB_0033e47b;
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  pcVar12 = (char *)(this->last_error_message_)._M_string_length;
  psVar13 = &this->last_error_message_;
  pcVar11 = "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
  ;
LAB_0033e47b:
  std::__cxx11::string::_M_replace((ulong)psVar13,0,pcVar12,(ulong)pcVar11);
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    const std::string& virtual_file, std::string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    last_error_message_ =
        "Backslashes, consecutive slashes, \".\", or \"..\" "
        "are not allowed in the virtual path";
    return NULL;
  }

  for (const auto& mapping : mappings_) {
    std::string temp_disk_file;
    if (ApplyMapping(virtual_file, mapping.virtual_path, mapping.disk_path,
                     &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != NULL) {
        if (disk_file != NULL) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        last_error_message_ =
            "Read access is denied for file: " + temp_disk_file;
        return NULL;
      }
    }
  }
  last_error_message_ = "File not found.";
  return NULL;
}